

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::make<std::__cxx11::string>(void)

{
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *args;
  proxy *dat;
  allocator_type<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_64UL,_cs_impl::default_allocator_provider>
  *in_RDI;
  allocator_type<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_64UL,_cs_impl::default_allocator_provider>
  *args_1;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  
  uVar1 = 1;
  args_1 = in_RDI;
  args = cs::
         allocator_type<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_64UL,_cs_impl::default_allocator_provider>
         ::alloc<>(in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,cs_impl::any::holder<std::__cxx11::string>*>
                  ((allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider>
                    *)CONCAT44(uVar1,in_stack_fffffffffffffff0),(int *)args,args_1->mPool);
  any((any *)in_RDI,dat);
  return (any)(proxy *)args_1;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}